

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

string * __thiscall
CRPCTable::help(string *__return_storage_ptr__,CRPCTable *this,string *strCommand,
               JSONRPCRequest *helpreq)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  CRPCCommand *__lhs;
  pointer ppVar3;
  bool bVar4;
  __type_conflict _Var5;
  _Base_ptr p_Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  pointer ppVar7;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<long>,_bool> pVar8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  vCommands;
  string strMethod;
  UniValue unused_result;
  JSONRPCRequest jreq;
  set<long,_std::less<long>,_std::allocator<long>_> setDone;
  string category;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  setDone._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &setDone._M_t._M_impl.super__Rb_tree_header._M_header;
  setDone._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  setDone._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  setDone._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  category._M_dataplus._M_p = (pointer)&category.field_2;
  category._M_string_length = 0;
  category.field_2._M_local_buf[0] = '\0';
  vCommands.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vCommands.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vCommands.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  setDone._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       setDone._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  ::reserve(&vCommands,(this->mapCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var6 = (this->mapCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(this->mapCommands)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&jreq,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   **(undefined8 **)(p_Var6 + 2),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var6 + 1)
                  );
    std::
    vector<std::pair<std::__cxx11::string,CRPCCommand_const*>,std::allocator<std::pair<std::__cxx11::string,CRPCCommand_const*>>>
    ::emplace_back<std::__cxx11::string,CRPCCommand_const*const&>
              ((vector<std::pair<std::__cxx11::string,CRPCCommand_const*>,std::allocator<std::pair<std::__cxx11::string,CRPCCommand_const*>>>
                *)&vCommands,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&jreq,
               *(CRPCCommand ***)(p_Var6 + 2));
    std::__cxx11::string::~string((string *)&jreq);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,CRPCCommand_const*>*,std::vector<std::pair<std::__cxx11::string,CRPCCommand_const*>,std::allocator<std::pair<std::__cxx11::string,CRPCCommand_const*>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (vCommands.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             vCommands.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  JSONRPCRequest::JSONRPCRequest(&jreq,helpreq);
  jreq.mode = GET_HELP;
  paVar1 = &unused_result.val.field_2;
  unused_result.val._M_string_length = 0;
  unused_result.val.field_2._M_local_buf[0] = '\0';
  unused_result.typ = VNULL;
  unused_result.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unused_result.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unused_result.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unused_result.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  unused_result.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  unused_result.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unused_result.val._M_dataplus._M_p = (pointer)paVar1;
  UniValue::operator=(&jreq.params,&unused_result);
  UniValue::~UniValue(&unused_result);
  ppVar3 = vCommands.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar7 = vCommands.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppVar7 == ppVar3) {
      bVar4 = std::operator==(__return_storage_ptr__,"");
      if (bVar4) {
        tinyformat::format<std::__cxx11::string>
                  ((string *)&unused_result,(tinyformat *)"help: unknown command: %s\n",
                   (char *)strCommand,args);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &unused_result);
        std::__cxx11::string::~string((string *)&unused_result);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&unused_result
                 ,__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length - 1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&unused_result
                );
      std::__cxx11::string::~string((string *)&unused_result);
      JSONRPCRequest::~JSONRPCRequest(&jreq);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
      ::~vector(&vCommands);
      std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      ~_Rb_tree(&setDone._M_t);
      std::__cxx11::string::~string((string *)&category);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    __lhs = ppVar7->second;
    std::__cxx11::string::string((string *)&strMethod,&__lhs->name);
    bVar4 = std::operator==(strCommand,"");
    if (bVar4) {
      bVar4 = std::operator==(&__lhs->category,"hidden");
      if (bVar4) goto LAB_00879d02;
LAB_00879d15:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&jreq.strMethod,&strMethod);
      unused_result.val._M_string_length = 0;
      unused_result.val.field_2._M_local_buf[0] = '\0';
      unused_result.typ = VNULL;
      unused_result.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      unused_result.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      unused_result.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      unused_result.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      unused_result.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      unused_result.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      unused_result.val._M_dataplus._M_p = (pointer)paVar1;
      pVar8 = std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
              _M_insert_unique<long_const&>
                        ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                          *)&setDone,&__lhs->unique_id);
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
        std::function<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool)>::operator()
                  (&__lhs->actor,&jreq,&unused_result,true);
      }
      UniValue::~UniValue(&unused_result);
    }
    else {
LAB_00879d02:
      _Var5 = std::operator==(&strMethod,strCommand);
      if (_Var5) goto LAB_00879d15;
    }
    std::__cxx11::string::~string((string *)&strMethod);
    ppVar7 = ppVar7 + 1;
  } while( true );
}

Assistant:

std::string CRPCTable::help(const std::string& strCommand, const JSONRPCRequest& helpreq) const
{
    std::string strRet;
    std::string category;
    std::set<intptr_t> setDone;
    std::vector<std::pair<std::string, const CRPCCommand*> > vCommands;
    vCommands.reserve(mapCommands.size());

    for (const auto& entry : mapCommands)
        vCommands.emplace_back(entry.second.front()->category + entry.first, entry.second.front());
    sort(vCommands.begin(), vCommands.end());

    JSONRPCRequest jreq = helpreq;
    jreq.mode = JSONRPCRequest::GET_HELP;
    jreq.params = UniValue();

    for (const std::pair<std::string, const CRPCCommand*>& command : vCommands)
    {
        const CRPCCommand *pcmd = command.second;
        std::string strMethod = pcmd->name;
        if ((strCommand != "" || pcmd->category == "hidden") && strMethod != strCommand)
            continue;
        jreq.strMethod = strMethod;
        try
        {
            UniValue unused_result;
            if (setDone.insert(pcmd->unique_id).second)
                pcmd->actor(jreq, unused_result, /*last_handler=*/true);
        }
        catch (const std::exception& e)
        {
            // Help text is returned in an exception
            std::string strHelp = std::string(e.what());
            if (strCommand == "")
            {
                if (strHelp.find('\n') != std::string::npos)
                    strHelp = strHelp.substr(0, strHelp.find('\n'));

                if (category != pcmd->category)
                {
                    if (!category.empty())
                        strRet += "\n";
                    category = pcmd->category;
                    strRet += "== " + Capitalize(category) + " ==\n";
                }
            }
            strRet += strHelp + "\n";
        }
    }
    if (strRet == "")
        strRet = strprintf("help: unknown command: %s\n", strCommand);
    strRet = strRet.substr(0,strRet.size()-1);
    return strRet;
}